

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testzlib.c
# Opt level: O1

int main(int argc,char **argv)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  ssh_decompressor *psVar4;
  FILE *__stream;
  size_t sVar5;
  long lVar6;
  char *__filename;
  char *__s1;
  int outlen;
  uchar *outbuf;
  uchar buf [16];
  int local_6c;
  int local_5c;
  uchar *local_58;
  undefined8 local_50;
  uchar local_48 [24];
  
  bVar1 = 1;
  local_50 = 0;
  lVar6 = 1;
  local_6c = 0;
  __filename = (char *)0x0;
  while (argc != (int)lVar6) {
    __s1 = argv[lVar6];
    if ((bool)(bVar1 & *__s1 == '-')) {
      iVar3 = strcmp(__s1,"-d");
      bVar2 = true;
      bVar1 = 1;
      if (iVar3 == 0) {
        local_50 = 1;
        __s1 = __filename;
      }
      else {
        iVar3 = strcmp(__s1,"--");
        if (iVar3 == 0) {
          bVar1 = 0;
          __s1 = __filename;
        }
        else {
          iVar3 = strcmp(__s1,"--help");
          if (iVar3 == 0) {
            puts("usage: testzlib          decode zlib (RFC1950) data from standard input");
            puts("       testzlib -d       decode Deflate (RFC1951) data from standard input");
            puts("       testzlib --help   display this text");
            local_6c = 0;
            bVar2 = false;
            __s1 = __filename;
          }
          else {
            bVar2 = false;
            fprintf(_stderr,"unknown command line option \'%s\'\n",__s1);
            bVar1 = 1;
            local_6c = 1;
            __s1 = __filename;
          }
        }
      }
    }
    else {
      bVar2 = true;
      if (__filename != (char *)0x0) {
        main_cold_1();
        local_6c = 1;
        bVar2 = false;
        __s1 = __filename;
      }
    }
    lVar6 = lVar6 + 1;
    __filename = __s1;
    if (!bVar2) {
      return local_6c;
    }
  }
  psVar4 = zlib_decompress_init();
  if (((int)local_50 != 0) &&
     ((*psVar4->vt->decompress)(psVar4,main::ersatz_zlib_header,2,&local_58,&local_5c),
     local_5c != 0)) {
    __assert_fail("outlen == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/test/testzlib.c"
                  ,0x4e,"int main(int, char **)");
  }
  __stream = _stdin;
  if (__filename != (char *)0x0) {
    __stream = fopen(__filename,"rb");
  }
  if (__stream == (FILE *)0x0) {
    if (__filename != (char *)0x0) {
      fprintf(_stderr,"unable to open \'%s\'\n");
      return 1;
    }
    __assert_fail("filename",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/test/testzlib.c"
                  ,0x57,"int main(int, char **)");
  }
  sVar5 = fread(local_48,1,0x10,__stream);
  if (0 < (int)sVar5) {
    do {
      (*psVar4->vt->decompress)(psVar4,local_48,(int)sVar5,&local_58,&local_5c);
      if (local_58 == (uchar *)0x0) {
        main_cold_2();
        return 1;
      }
      if ((long)local_5c != 0) {
        fwrite(local_58,1,(long)local_5c,_stdout);
      }
      safefree(local_58);
      sVar5 = fread(local_48,1,0x10,__stream);
    } while (0 < (int)sVar5);
  }
  (*psVar4->vt->decompress_free)(psVar4);
  if (__filename != (char *)0x0) {
    fclose(__stream);
  }
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
    unsigned char buf[16], *outbuf;
    int ret, outlen;
    ssh_decompressor *handle;
    int noheader = false, opts = true;
    char *filename = NULL;
    FILE *fp;

    while (--argc) {
        char *p = *++argv;

        if (p[0] == '-' && opts) {
            if (!strcmp(p, "-d")) {
                noheader = true;
            } else if (!strcmp(p, "--")) {
                opts = false;          /* next thing is filename */
            } else if (!strcmp(p, "--help")) {
                printf("usage: testzlib          decode zlib (RFC1950) data"
                       " from standard input\n");
                printf("       testzlib -d       decode Deflate (RFC1951) data"
                       " from standard input\n");
                printf("       testzlib --help   display this text\n");
                return 0;
            } else {
                fprintf(stderr, "unknown command line option '%s'\n", p);
                return 1;
            }
        } else if (!filename) {
            filename = p;
        } else {
            fprintf(stderr, "can only handle one filename\n");
            return 1;
        }
    }

    handle = ssh_decompressor_new(&ssh_zlib);

    if (noheader) {
        /*
         * Provide missing zlib header if -d was specified.
         */
        static const unsigned char ersatz_zlib_header[] = { 0x78, 0x9C };
        ssh_decompressor_decompress(
            handle, ersatz_zlib_header, sizeof(ersatz_zlib_header),
            &outbuf, &outlen);
        assert(outlen == 0);
    }

    if (filename)
        fp = fopen(filename, "rb");
    else
        fp = stdin;

    if (!fp) {
        assert(filename);
        fprintf(stderr, "unable to open '%s'\n", filename);
        return 1;
    }

    while (1) {
        ret = fread(buf, 1, sizeof(buf), fp);
        if (ret <= 0)
            break;
        ssh_decompressor_decompress(handle, buf, ret, &outbuf, &outlen);
        if (outbuf) {
            if (outlen)
                fwrite(outbuf, 1, outlen, stdout);
            sfree(outbuf);
        } else {
            fprintf(stderr, "decoding error\n");
            fclose(fp);
            return 1;
        }
    }

    ssh_decompressor_free(handle);

    if (filename)
        fclose(fp);

    return 0;
}